

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

bool check_deferring_event(Am_Object *inter,Am_Input_Char target_char,Am_Input_Char input_char)

{
  bool bVar1;
  Am_Input_Char local_24;
  Am_Object *pAStack_20;
  Am_Input_Char ic2;
  Am_Object *inter_local;
  ushort uStack_e;
  Am_Input_Char input_char_local;
  Am_Input_Char target_char_local;
  
  uStack_e = target_char._2_2_;
  if (((uStack_e >> 4 & 0xf) == 4) || ((uStack_e >> 4 & 0xf) == 5)) {
    local_24 = (Am_Input_Char)((uint)target_char & 0xff0fffff | 0x100000);
    pAStack_20 = inter;
    bVar1 = Am_Input_Char::operator==(&local_24,input_char);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool
check_deferring_event(Am_Object &inter, Am_Input_Char target_char,
                      Am_Input_Char input_char)
{
  if (target_char.button_down == Am_BUTTON_CLICK ||
      target_char.button_down == Am_BUTTON_DRAG) {
    Am_Input_Char ic2 = target_char;
    ic2.button_down = Am_BUTTON_DOWN;
    if (ic2 == input_char) {
      Am_INTER_TRACE_PRINT_NOENDL(inter, "(click/drag match)");
      return true;
    }
  }
  return false;
}